

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  ulong uVar3;
  int iVar4;
  FileDescriptorProto *pFVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  FileDescriptorProto temp;
  FileDescriptorProto FStack_108;
  
  uVar7 = 0;
  pFVar5 = output;
  while( true ) {
    bVar9 = (byte)pFVar5;
    ppDVar1 = (this->sources_).
              super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3;
    if (uVar8 <= uVar7) break;
    pDVar2 = ppDVar1[uVar7];
    pFVar5 = output;
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[4])(pDVar2,containing_type,(ulong)(uint)field_number)
    ;
    if ((char)iVar4 != '\0') {
      FileDescriptorProto::FileDescriptorProto(&FStack_108);
      uVar3 = 0;
      goto LAB_0030b44f;
    }
    uVar7 = uVar7 + 1;
  }
  goto LAB_0030b487;
  while( true ) {
    pDVar2 = (this->sources_).
             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6];
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[2])(pDVar2,(output->name_).ptr_,&FStack_108);
    uVar3 = uVar6 + 1;
    if ((char)iVar4 != '\0') break;
LAB_0030b44f:
    uVar6 = uVar3;
    if (uVar7 == uVar6) break;
  }
  bVar9 = uVar7 <= uVar6;
  FileDescriptorProto::~FileDescriptorProto(&FStack_108);
LAB_0030b487:
  return (bool)(uVar7 < uVar8 & bVar9);
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingExtension(
    const string& containing_type,
    int field_number,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingExtension(
          containing_type, field_number, output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}